

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O1

bool __thiscall
nuraft::snapshot_io_mgr::has_pending_request(snapshot_io_mgr *this,raft_server *r,int srv_id)

{
  int iVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->queue_lock_);
  if (iVar1 == 0) {
    p_Var2 = (this->queue_).
             super__List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    while ((bVar3 = p_Var2 != (_List_node_base *)&this->queue_, bVar3 &&
           (((raft_server *)(p_Var2[1]._M_next)->_M_next != r ||
            (**(int **)p_Var2[1]._M_next[3]._M_next != srv_id))))) {
      p_Var2 = p_Var2->_M_next;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->queue_lock_);
    return bVar3;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

bool snapshot_io_mgr::has_pending_request(raft_server* r, int srv_id) {
    auto_lock(queue_lock_);
    for (auto& entry: queue_) {
        if ( entry->raft_.get() == r &&
             entry->dst_->get_id() == srv_id ) {
            return true;
        }
    }
    return false;
}